

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.cpp
# Opt level: O2

string * EncodeBase58_abi_cxx11_(string *__return_storage_ptr__,Span<const_unsigned_char> input)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __tmp;
  pointer puVar10;
  byte *pbVar11;
  long lVar12;
  int iVar13;
  byte *pbVar14;
  long in_FS_OFFSET;
  bool bVar15;
  allocator_type local_51;
  vector<unsigned_char,_std::allocator<unsigned_char>_> b58;
  
  uVar7 = input.m_size;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = uVar7 * 0x8a;
  uVar6 = 0;
  do {
    lVar12 = uVar7 - uVar6;
    uVar2 = uVar7;
    if (lVar12 == 0) {
LAB_00551e45:
      pbVar11 = input.m_data + uVar2;
      iVar13 = (int)(uVar4 / 100) + 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&b58,(long)iVar13,&local_51);
      uVar8 = 0;
      do {
        bVar15 = lVar12 == 0;
        lVar12 = lVar12 + -1;
        if (bVar15) {
          for (pbVar11 = b58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + (int)(iVar13 - uVar8);
              (pbVar14 = b58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish,
              pbVar11 !=
              b58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish && (pbVar14 = pbVar11, *pbVar11 == 0));
              pbVar11 = pbVar11 + 1) {
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                    (__return_storage_ptr__,
                     (size_type)
                     (b58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish + ((uVar7 & 0xffffffff) - (long)pbVar14)));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (__return_storage_ptr__,uVar7 & 0xffffffff,'1');
          for (; pbVar14 !=
                 b58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish; pbVar14 = pbVar14 + 1) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(__return_storage_ptr__,
                      "123456789ABCDEFGHJKLMNPQRSTUVWXYZabcdefghijkmnopqrstuvwxyz"[*pbVar14]);
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&b58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
            __stack_chk_fail();
          }
          return __return_storage_ptr__;
        }
        uVar3 = (uint)*pbVar11;
        puVar10 = b58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (uVar9 = 0; uVar9 < uVar8 || uVar3 != 0; uVar9 = uVar9 + 1) {
          if (puVar10 ==
              b58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start) {
            if (uVar3 != 0) {
              __assert_fail("carry == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/base58.cpp"
                            ,0x70,"std::string EncodeBase58(Span<const unsigned char>)");
            }
            break;
          }
          iVar5 = (uint)puVar10[-1] * 0x100 + uVar3;
          uVar3 = iVar5 / 0x3a;
          puVar10[-1] = (uchar)(iVar5 % 0x3a);
          puVar10 = puVar10 + -1;
        }
        pbVar11 = pbVar11 + 1;
        uVar8 = uVar9;
      } while( true );
    }
    if (input.m_data[uVar6] != '\0') {
      uVar7 = uVar6 & 0xffffffff;
      uVar2 = uVar6;
      goto LAB_00551e45;
    }
    uVar6 = uVar6 + 1;
    uVar4 = uVar4 - 0x8a;
  } while( true );
}

Assistant:

std::string EncodeBase58(Span<const unsigned char> input)
{
    // Skip & count leading zeroes.
    int zeroes = 0;
    int length = 0;
    while (input.size() > 0 && input[0] == 0) {
        input = input.subspan(1);
        zeroes++;
    }
    // Allocate enough space in big-endian base58 representation.
    int size = input.size() * 138 / 100 + 1; // log(256) / log(58), rounded up.
    std::vector<unsigned char> b58(size);
    // Process the bytes.
    while (input.size() > 0) {
        int carry = input[0];
        int i = 0;
        // Apply "b58 = b58 * 256 + ch".
        for (std::vector<unsigned char>::reverse_iterator it = b58.rbegin(); (carry != 0 || i < length) && (it != b58.rend()); it++, i++) {
            carry += 256 * (*it);
            *it = carry % 58;
            carry /= 58;
        }

        assert(carry == 0);
        length = i;
        input = input.subspan(1);
    }
    // Skip leading zeroes in base58 result.
    std::vector<unsigned char>::iterator it = b58.begin() + (size - length);
    while (it != b58.end() && *it == 0)
        it++;
    // Translate the result into a string.
    std::string str;
    str.reserve(zeroes + (b58.end() - it));
    str.assign(zeroes, '1');
    while (it != b58.end())
        str += pszBase58[*(it++)];
    return str;
}